

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O2

void SysPageProtect(void *page,int protect)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  AddressRange **ppAVar10;
  
  pvVar6 = pthread_getspecific(tsdKey);
  iVar4 = *(int *)((long)pvVar6 + 0x460);
  *(int *)((long)pvVar6 + 0x460) = iVar4 + 1;
  if (iVar4 == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
  }
  ppAVar10 = &ranges;
  do {
    ppAVar10 = &((AddressRange *)ppAVar10)->next->next;
    bVar5 = (byte)shiftPage;
    if ((AddressRange *)ppAVar10 == (AddressRange *)0x0) {
      ppAVar10 = &dedicatedRanges;
      goto LAB_001060fe;
    }
    pvVar6 = ((AddressRange *)ppAVar10)->base;
  } while ((page < pvVar6) ||
          ((void *)((((AddressRange *)ppAVar10)->size << (bVar5 & 0x3f)) + (long)pvVar6) <= page));
  lVar7 = (long)page - (long)pvVar6 >> (bVar5 & 0x3f);
  bVar3 = *(byte *)((long)&((AddressRange *)((long)ppAVar10 + 0x28))->next + lVar7);
  bVar9 = 0;
  if ('\0' < (char)bVar3) {
    bVar9 = bVar3;
  }
  uVar8 = lVar7 - (ulong)bVar9;
  PlatProtectPages((void *)((uVar8 << (bVar5 & 0x3f)) + (long)pvVar6),
                   -(long)*(char *)((long)ppAVar10 + uVar8 + 0x28),protect);
  bVar5 = '\x01' << ((byte)uVar8 & 7);
  if (protect == 0) {
    pbVar2 = (byte *)((long)&((AddressRange *)((long)ppAVar10 + 0x28))->next +
                     (uVar8 >> 3) + ((AddressRange *)ppAVar10)->size);
    *pbVar2 = *pbVar2 | bVar5;
  }
  else {
    pbVar2 = (byte *)((long)&((AddressRange *)((long)ppAVar10 + 0x28))->next +
                     (uVar8 >> 3) + ((AddressRange *)ppAVar10)->size);
    *pbVar2 = *pbVar2 & ~bVar5;
  }
  goto LAB_00106156;
  while ((pvVar6 = ((AddressRange *)ppAVar10)->base, page < pvVar6 ||
         ((void *)((((AddressRange *)ppAVar10)->size << (bVar5 & 0x3f)) + (long)pvVar6) <= page))) {
LAB_001060fe:
    ppAVar10 = &((AddressRange *)ppAVar10)->next->next;
    if ((AddressRange *)ppAVar10 == (AddressRange *)0x0) {
      Col_Error(COL_FATAL,ColibriDomain,2,"Page not found");
      goto LAB_00106156;
    }
  }
  PlatProtectPages(pvVar6,((AddressRange *)ppAVar10)->size,protect);
  *(bool *)&((AddressRange *)((long)ppAVar10 + 0x28))->next = protect == 0;
LAB_00106156:
  pvVar6 = pthread_getspecific(tsdKey);
  piVar1 = (int *)((long)pvVar6 + 0x460);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
  return;
}

Assistant:

void
SysPageProtect(
    void * page,    /*!< Page belonging to page group to protect. */
    int protect)    /*!< Whether to protect or unprotect page group. */
{
    size_t index, size;
    AddressRange * range;

    PlatEnterProtectAddressRanges();
    {
        /*
         * Get range info for page.
         */

        range = ranges;
        while (range) {
            if (page >= range->base && (char *) page < (char *) range->base
                    + (range->size << shiftPage)) {
                break;
            }
            range = range->next;
        }
        if (!range) {
            /*
             * Likely dedicated address range.
             */

            range = dedicatedRanges;
            while (range) {
                if (page >= range->base && (char *) page < (char *) range->base
                        + (range->size << shiftPage)) {
                    break;
                }
                range = range->next;
            }
            if (!range) {
                /*
                 * Not found.
                 */

                /*! @fatal{COL_ERROR_MEMORY,Page not found} */
                Col_Error(COL_FATAL, ColibriDomain, COL_ERROR_MEMORY,
                        "Page not found");
                goto end;
            }

            /*
             * Update protection & write tracking flag for whole range.
             */

            PlatProtectPages(range->base, range->size, protect);
            range->allocInfo[0] = !protect;
            goto end;
        }

        index = ((char *) page - (char *) range->base) >> shiftPage;
        ASSERT(range->allocInfo[index] != 0);
        if (range->allocInfo[index] > 0) index -= range->allocInfo[index];
        size = -range->allocInfo[index];
        ASSERT(size > 0);
        ASSERT(index+size <= range->size);

        /*
         * Update protection & write tracking flag for page group (only mark
         * first one in page group).
         */

        PlatProtectPages((char *) range->base + (index << shiftPage), size,
                protect);
        if (protect) {
            range->allocInfo[range->size+(index>>3)] &= ~(1<<(index&7));
        } else {
            range->allocInfo[range->size+(index>>3)] |= (1<<(index&7));
        }
    }
end:
    PlatLeaveProtectAddressRanges();
}